

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O1

int EventThread(ALCcontext *context)

{
  uint uVar1;
  RingBuffer *this;
  ALEVENTPROCSOFT p_Var2;
  uint uVar3;
  ALuint AVar4;
  char cVar5;
  char cVar6;
  int iVar7;
  size_t sVar8;
  long *plVar9;
  uint uVar10;
  uint uVar11;
  long *plVar12;
  RingBuffer *__stat_loc;
  long lVar13;
  void *__src;
  bool bVar14;
  string msg;
  string msg_1;
  AsyncEvent evt;
  long *local_198;
  long local_190;
  long local_188;
  long lStack_180;
  char *local_178;
  uint local_170;
  char local_168 [16];
  long *local_158;
  uint local_150;
  long local_148 [2];
  semaphore *local_138;
  ll_ringbuffer_data_pair local_130 [8];
  
  this = (context->mAsyncEvents)._M_t.
         super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>._M_t.
         super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>.
         super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl;
  local_138 = &context->mEventSem;
  bVar14 = false;
  do {
    __stat_loc = this;
    RingBuffer::getReadVector(local_130,this);
    lVar13 = CONCAT44(local_130[0].first.len._4_4_,(uint)local_130[0].first.len);
    if (lVar13 == 0) {
      al::semaphore::wait(local_138,__stat_loc);
    }
    else {
      __src = (void *)CONCAT44(local_130[0].first.buf._4_4_,(uint)local_130[0].first.buf);
      iVar7 = pthread_mutex_lock((pthread_mutex_t *)&context->mEventCbLock);
      if (iVar7 != 0) {
        std::__throw_system_error(iVar7);
      }
      do {
        memcpy(local_130,__src,0x100);
        RingBuffer::readAdvance(this,1);
        AVar4 = (ALuint)local_130[0].second.buf;
        uVar10 = local_130[0].first.len._4_4_;
        uVar11 = (uint)local_130[0].first.len;
        uVar3 = (uint)local_130[0].first.buf;
        if ((uint)local_130[0].first.buf != 0) {
          if ((uint)local_130[0].first.buf == 0x10000) {
            EventThread();
          }
          else {
            uVar1 = (context->mEnabledEvts).super___atomic_base<unsigned_int>._M_i;
            p_Var2 = context->mEventCb;
            if (p_Var2 != (ALEVENTPROCSOFT)0x0) {
              if ((uint)local_130[0].first.buf == 2) {
                if ((uVar1 & 2) != 0) {
                  cVar6 = '\x01';
                  if (9 < local_130[0].first.len._4_4_) {
                    uVar11 = local_130[0].first.len._4_4_;
                    cVar5 = '\x04';
                    do {
                      cVar6 = cVar5;
                      if (uVar11 < 100) {
                        cVar6 = cVar6 + -2;
                        goto LAB_0011f11e;
                      }
                      if (uVar11 < 1000) {
                        cVar6 = cVar6 + -1;
                        goto LAB_0011f11e;
                      }
                      if (uVar11 < 10000) goto LAB_0011f11e;
                      bVar14 = 99999 < uVar11;
                      uVar11 = uVar11 / 10000;
                      cVar5 = cVar6 + '\x04';
                    } while (bVar14);
                    cVar6 = cVar6 + '\x01';
                  }
LAB_0011f11e:
                  local_178 = local_168;
                  std::__cxx11::string::_M_construct((ulong)&local_178,cVar6);
                  std::__detail::__to_chars_10_impl<unsigned_int>(local_178,local_170,uVar10);
                  std::__cxx11::string::append((char *)&local_178);
                  (*context->mEventCb)
                            (0x19a4,(uint)local_130[0].first.len,local_130[0].first.len._4_4_,
                             local_170,local_178,context->mEventParam);
                  EventThread();
                }
              }
              else if ((uint)local_130[0].first.buf == 1) {
                if ((uVar1 & 1) != 0) {
                  cVar6 = '\x01';
                  if (9 < (uint)local_130[0].first.len) {
                    uVar10 = (uint)local_130[0].first.len;
                    cVar5 = '\x04';
                    do {
                      cVar6 = cVar5;
                      if (uVar10 < 100) {
                        cVar6 = cVar6 + -2;
                        goto LAB_0011efdf;
                      }
                      if (uVar10 < 1000) {
                        cVar6 = cVar6 + -1;
                        goto LAB_0011efdf;
                      }
                      if (uVar10 < 10000) goto LAB_0011efdf;
                      bVar14 = 99999 < uVar10;
                      uVar10 = uVar10 / 10000;
                      cVar5 = cVar6 + '\x04';
                    } while (bVar14);
                    cVar6 = cVar6 + '\x01';
                  }
LAB_0011efdf:
                  local_158 = local_148;
                  std::__cxx11::string::_M_construct((ulong)&local_158,cVar6);
                  std::__detail::__to_chars_10_impl<unsigned_int>
                            ((char *)local_158,local_150,uVar11);
                  plVar9 = (long *)std::__cxx11::string::replace
                                             ((ulong)&local_158,0,(char *)0x0,0x17381e);
                  local_198 = (long *)*plVar9;
                  plVar12 = plVar9 + 2;
                  if (local_198 == plVar12) {
                    local_188 = *plVar12;
                    lStack_180 = plVar9[3];
                    local_198 = &local_188;
                  }
                  else {
                    local_188 = *plVar12;
                  }
                  local_190 = plVar9[1];
                  *plVar9 = (long)plVar12;
                  plVar9[1] = 0;
                  *(undefined1 *)(plVar9 + 2) = 0;
                  if (local_158 != local_148) {
                    operator_delete(local_158,local_148[0] + 1);
                  }
                  std::__cxx11::string::append((char *)&local_198);
                  std::__cxx11::string::append((char *)&local_198);
                  (*context->mEventCb)
                            (0x19a5,(uint)local_130[0].first.len,local_130[0].first.len._4_4_,
                             (ALsizei)local_190,(ALchar *)local_198,context->mEventParam);
                  EventThread();
                }
              }
              else if (((uint)local_130[0].first.buf & ~uVar1) == 0) {
                sVar8 = strlen((char *)((long)&local_130[0].second.buf + 4));
                (*p_Var2)(uVar11,uVar10,AVar4,(ALsizei)sVar8,
                          (ALchar *)((long)&local_130[0].second.buf + 4),context->mEventParam);
              }
            }
          }
        }
        if (uVar3 == 0) break;
        __src = (void *)((long)__src + 0x100);
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
      bVar14 = uVar3 == 0;
      pthread_mutex_unlock((pthread_mutex_t *)&context->mEventCbLock);
    }
    if (bVar14) {
      return 0;
    }
  } while( true );
}

Assistant:

static int EventThread(ALCcontext *context)
{
    RingBuffer *ring{context->mAsyncEvents.get()};
    bool quitnow{false};
    while LIKELY(!quitnow)
    {
        auto evt_data = ring->getReadVector().first;
        if(evt_data.len == 0)
        {
            context->mEventSem.wait();
            continue;
        }

        std::lock_guard<std::mutex> _{context->mEventCbLock};
        do {
            auto *evt_ptr = reinterpret_cast<AsyncEvent*>(evt_data.buf);
            evt_data.buf += sizeof(AsyncEvent);
            evt_data.len -= 1;

            AsyncEvent evt{*evt_ptr};
            al::destroy_at(evt_ptr);
            ring->readAdvance(1);

            quitnow = evt.EnumType == EventType_KillThread;
            if UNLIKELY(quitnow) break;

            if(evt.EnumType == EventType_ReleaseEffectState)
            {
                evt.u.mEffectState->release();
                continue;
            }

            ALbitfieldSOFT enabledevts{context->mEnabledEvts.load(std::memory_order_acquire)};
            if(!context->mEventCb) continue;

            if(evt.EnumType == EventType_SourceStateChange)
            {
                if(!(enabledevts&EventType_SourceStateChange))
                    continue;
                std::string msg{"Source ID " + std::to_string(evt.u.srcstate.id)};
                msg += " state has changed to ";
                msg += (evt.u.srcstate.state==AL_INITIAL) ? "AL_INITIAL" :
                    (evt.u.srcstate.state==AL_PLAYING) ? "AL_PLAYING" :
                    (evt.u.srcstate.state==AL_PAUSED) ? "AL_PAUSED" :
                    (evt.u.srcstate.state==AL_STOPPED) ? "AL_STOPPED" : "<unknown>";
                context->mEventCb(AL_EVENT_TYPE_SOURCE_STATE_CHANGED_SOFT, evt.u.srcstate.id,
                    static_cast<ALuint>(evt.u.srcstate.state), static_cast<ALsizei>(msg.length()),
                    msg.c_str(), context->mEventParam);
            }
            else if(evt.EnumType == EventType_BufferCompleted)
            {
                if(!(enabledevts&EventType_BufferCompleted))
                    continue;
                std::string msg{std::to_string(evt.u.bufcomp.count)};
                if(evt.u.bufcomp.count == 1) msg += " buffer completed";
                else msg += " buffers completed";
                context->mEventCb(AL_EVENT_TYPE_BUFFER_COMPLETED_SOFT, evt.u.bufcomp.id,
                    evt.u.bufcomp.count, static_cast<ALsizei>(msg.length()), msg.c_str(),
                    context->mEventParam);
            }
            else if((enabledevts&evt.EnumType) == evt.EnumType)
                context->mEventCb(evt.u.user.type, evt.u.user.id, evt.u.user.param,
                    static_cast<ALsizei>(strlen(evt.u.user.msg)), evt.u.user.msg,
                    context->mEventParam);
        } while(evt_data.len != 0);
    }